

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

uint8_t * google::protobuf::internal::WireFormat::InternalSerializeField
                    (FieldDescriptor *field,Message *message,uint8_t *target,
                    EpsCopyOutputStream *stream)

{
  int *piVar1;
  anon_union_8_2_4f9aec01_for_ShortSooRep_1 *paVar2;
  ushort uVar3;
  char *pcVar4;
  size_t sVar5;
  bool bVar6;
  bool bVar7;
  byte extraout_AL;
  byte bVar8;
  uint uVar9;
  uint32_t uVar10;
  CppStringType CVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  MapFieldBase *this;
  RepeatedField<double> *rhs;
  uint64_t uVar15;
  long lVar16;
  EnumValueDescriptor *pEVar17;
  string *psVar18;
  MessageLite *pMVar19;
  uint8_t *puVar20;
  RepeatedField<int> *pRVar21;
  RepeatedField<unsigned_int> *pRVar22;
  RepeatedField<long> *pRVar23;
  size_t sVar24;
  RepeatedField<float> *rhs_00;
  RepeatedField<unsigned_long> *pRVar25;
  RepeatedField<bool> *rhs_01;
  int *piVar26;
  anon_union_8_2_4f9aec01_for_ShortSooRep_1 *paVar27;
  ulong uVar28;
  Nonnull<const_char_*> pcVar29;
  byte v1;
  uint uVar30;
  DescriptorPool *pDVar31;
  uint size;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> key;
  long lVar32;
  ulong uVar33;
  char *in_R9;
  byte *pbVar34;
  float fVar35;
  double dVar36;
  string_view s;
  string_view s_00;
  Metadata MVar37;
  string_view field_name;
  MapValueConstRef map_value;
  vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> sorted_key_list;
  LogMessageData *local_f8;
  undefined1 local_e8 [72];
  undefined1 local_a0 [16];
  undefined1 local_90 [40];
  MapValueConstRef local_68;
  FeatureSet *local_58;
  DescriptorPool *local_50;
  __uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  local_48;
  Descriptor *local_40;
  EnumDescriptor *local_38;
  
  MVar37 = Message::GetMetadata(message);
  pDVar31 = (DescriptorPool *)MVar37.reflection;
  bVar8 = field->field_0x1;
  if ((((bVar8 & 8) != 0) &&
      ((field->containing_type_->options_->field_0)._impl_.message_set_wire_format_ == true)) &&
     (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 10)) {
    if (0xbf < bVar8 == (bool)((bVar8 & 0x20) >> 5)) {
      if ((bVar8 & 0x20) == 0) {
        puVar20 = InternalSerializeMessageSetItem(field,message,target,stream);
        return puVar20;
      }
      goto LAB_00264335;
    }
    InternalSerializeField();
LAB_002665c4:
    uVar9 = (uint)pDVar31;
    target = io::EpsCopyOutputStream::EnsureSpaceFallback((EpsCopyOutputStream *)message,target);
LAB_002654dd:
    iVar12 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep,
                          (local_e8._0_8_ & 4) == 0);
    if (((EpsCopyOutputStream *)message)->end_ <= target) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
LAB_00266520:
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_a0);
    }
    size = iVar12 << 3;
    uVar30 = uVar9 * 8 + 2;
    uVar14 = uVar30;
    if (0x7f < uVar9 << 3) {
      do {
        *target = (byte)uVar14 | 0x80;
        uVar30 = uVar14 >> 7;
        target = target + 1;
        bVar7 = 0x3fff < uVar14;
        uVar14 = uVar30;
      } while (bVar7);
    }
    *target = (byte)uVar30;
    pbVar34 = target + 1;
    uVar9 = size;
    uVar14 = size;
    if (0x7f < size) {
      do {
        target = pbVar34;
        *target = (byte)uVar14 | 0x80;
        uVar9 = uVar14 >> 7;
        pbVar34 = target + 1;
        bVar7 = 0x3fff < uVar14;
        message = (Message *)stream;
        uVar14 = uVar9;
      } while (bVar7);
    }
    *pbVar34 = (byte)uVar9;
    if ((local_e8._0_8_ & 4) == 0) {
      piVar26 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep).size;
    }
    else {
      piVar26 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep);
    }
    pbVar34 = target + 2;
    if ((long)((EpsCopyOutputStream *)message)->end_ - (long)pbVar34 < (long)(int)size) {
      target = io::EpsCopyOutputStream::WriteRawFallback
                         ((EpsCopyOutputStream *)message,piVar26,size,pbVar34);
    }
    else {
      memcpy(pbVar34,piVar26,(ulong)size);
      target = pbVar34 + (int)size;
    }
    goto LAB_00265c6f;
  }
LAB_00264335:
  local_50 = pDVar31;
  if ((field->type_ == '\v') && (bVar7 = FieldDescriptor::is_map_message_type(field), bVar7)) {
    this = Reflection::GetMapData((Reflection *)pDVar31,message,field);
    bVar7 = MapFieldBase::IsMapValid(this);
    if (!bVar7) goto LAB_00264415;
    if (stream->is_serialization_deterministic_ != true) {
      Reflection::MapBegin((MapIterator *)local_a0,(Reflection *)pDVar31,message,field);
      Reflection::MapEnd((MapIterator *)
                         &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep,
                         (Reflection *)pDVar31,message,field);
      bVar7 = MapFieldBase::EqualIterator
                        ((MapFieldBase *)local_90._8_8_,(MapIterator *)local_a0,
                         (MapIterator *)
                         &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep);
      pDVar31 = local_50;
      if (bVar7) {
        return target;
      }
      local_40 = (Descriptor *)message;
      do {
        target = InternalSerializeMapEntry
                           (field,(MapKey *)(local_90 + 0x10),&local_68,target,stream);
        MapFieldBase::IncreaseIterator((MapFieldBase *)local_90._8_8_,(MapIterator *)local_a0);
        Reflection::MapEnd((MapIterator *)
                           &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep,
                           (Reflection *)pDVar31,(Message *)local_40,field);
        bVar7 = MapFieldBase::EqualIterator
                          ((MapFieldBase *)local_90._8_8_,(MapIterator *)local_a0,
                           (MapIterator *)
                           &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep);
      } while (!bVar7);
      return target;
    }
    MapKeySorter::SortKey
              ((vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> *)
               local_a0,message,(Reflection *)pDVar31,field);
    if (local_a0._0_8_ != local_a0._8_8_) {
      key._M_head_impl = (LogMessageData *)local_a0._0_8_;
      do {
        local_e8._0_8_ = 0;
        local_e8._8_4_ = 0;
        Reflection::LookupMapValue
                  ((Reflection *)local_50,message,field,(MapKey *)key._M_head_impl,
                   (MapValueConstRef *)
                   &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep);
        target = InternalSerializeMapEntry
                           (field,(MapKey *)key._M_head_impl,
                            (MapValueConstRef *)
                            &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep,target,
                            stream);
        key._M_head_impl = (LogMessageData *)((long)&(key._M_head_impl)->entry + 0x18);
      } while (key._M_head_impl != (LogMessageData *)local_a0._8_8_);
    }
    if ((Descriptor *)local_a0._0_8_ == (Descriptor *)0x0) {
      return target;
    }
    uVar33 = CONCAT71(local_90._1_7_,local_90[0]) - local_a0._0_8_;
    local_f8 = (LogMessageData *)local_a0._0_8_;
    goto LAB_002661ac;
  }
LAB_00264415:
  bVar8 = field->field_0x1;
  v1 = (bVar8 & 0x20) >> 5;
  if (0xbf < bVar8 != (bool)v1) {
    InternalSerializeField();
    bVar8 = extraout_AL;
LAB_002661db:
    pcVar29 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                        ((bool)v1,0xbf < bVar8,
                         "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_a0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
               ,0xb54,pcVar29);
    goto LAB_00266520;
  }
  if ((bVar8 & 0x20) == 0) {
    if ((field->containing_type_->options_->field_0)._impl_.map_entry_ == false) {
      bVar7 = Reflection::HasField((Reflection *)pDVar31,message,field);
      uVar9 = (uint)bVar7;
    }
    else {
      uVar9 = 1;
    }
LAB_002644f1:
    local_f8 = (LogMessageData *)0x0;
    local_48._M_t.
    super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
    _M_head_impl = (tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                    )(_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                      )0x0;
    local_58 = (FeatureSet *)0x0;
  }
  else {
    uVar9 = Reflection::FieldSize((Reflection *)pDVar31,message,field);
    if (((int)uVar9 < 2) || (field->type_ != '\v')) goto LAB_002644f1;
    local_58 = (FeatureSet *)0x0;
    bVar7 = FieldDescriptor::is_map_message_type(field);
    if ((!bVar7) || (stream->is_serialization_deterministic_ != true)) goto LAB_002644f1;
    DynamicMapSorter::Sort
              ((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                *)local_a0,message,uVar9,(Reflection *)local_50,field);
    local_f8 = (LogMessageData *)local_a0._0_8_;
    local_48._M_t.
    super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
    _M_head_impl = (tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                    )(tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                      )local_a0._8_8_;
    local_58 = (FeatureSet *)CONCAT71(local_90._1_7_,local_90[0]);
    pDVar31 = local_50;
  }
  bVar7 = FieldDescriptor::is_packed(field);
  if (!bVar7) {
    if (0 < (int)uVar9) {
      local_38 = (EnumDescriptor *)(ulong)uVar9;
      lVar32 = 0;
      local_40 = (Descriptor *)message;
      do {
        if (stream->end_ <= target) {
          target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        iVar12 = (int)lVar32;
        switch(field->type_) {
        case '\x01':
          bVar8 = field->field_0x1;
          bVar7 = (bool)((bVar8 & 0x20) >> 5);
          if (0xbf < bVar8 == bVar7) {
            if ((bVar8 & 0x20) == 0) {
              dVar36 = Reflection::GetDouble((Reflection *)pDVar31,message,field);
            }
            else {
              dVar36 = Reflection::GetRepeatedDouble((Reflection *)pDVar31,message,field,iVar12);
            }
            uVar33 = (ulong)(field->number_ * 8 + 1);
            if (0x7f < (uint)(field->number_ << 3)) {
              do {
                uVar9 = (uint)uVar33;
                *target = (byte)uVar33 | 0x80;
                uVar33 = uVar33 >> 7;
                target = target + 1;
              } while (0x3fff < uVar9);
            }
            *target = (byte)uVar33;
            *(double *)(target + 1) = dVar36;
            goto LAB_00264e05;
          }
          pcVar29 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                              (bVar7,0xbf < bVar8,
                               "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,pcVar29);
          goto LAB_00266520;
        case '\x02':
          bVar8 = field->field_0x1;
          bVar7 = (bool)((bVar8 & 0x20) >> 5);
          if (0xbf < bVar8 == bVar7) {
            if ((bVar8 & 0x20) == 0) {
              fVar35 = Reflection::GetFloat((Reflection *)pDVar31,message,field);
            }
            else {
              fVar35 = Reflection::GetRepeatedFloat((Reflection *)pDVar31,message,field,iVar12);
            }
            uVar33 = (ulong)(field->number_ * 8 + 5);
            if (0x7f < (uint)(field->number_ << 3)) {
              do {
                uVar9 = (uint)uVar33;
                *target = (byte)uVar33 | 0x80;
                uVar33 = uVar33 >> 7;
                target = target + 1;
              } while (0x3fff < uVar9);
            }
            *target = (byte)uVar33;
            *(float *)(target + 1) = fVar35;
            goto LAB_00264e89;
          }
          pcVar29 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                              (bVar7,0xbf < bVar8,
                               "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,pcVar29);
          goto LAB_00266520;
        case '\x03':
          bVar8 = field->field_0x1;
          bVar7 = (bool)((bVar8 & 0x20) >> 5);
          if (0xbf < bVar8 == bVar7) {
            if ((bVar8 & 0x20) == 0) {
              uVar28 = Reflection::GetInt64((Reflection *)pDVar31,message,field);
            }
            else {
              uVar28 = Reflection::GetRepeatedInt64((Reflection *)pDVar31,message,field,iVar12);
            }
            uVar14 = field->number_ << 3;
            uVar9 = uVar14;
            if (0x7f < uVar14) {
              do {
                *target = (byte)uVar9 | 0x80;
                uVar14 = uVar9 >> 7;
                target = target + 1;
                bVar7 = 0x3fff < uVar9;
                uVar9 = uVar14;
              } while (bVar7);
            }
            *target = (byte)uVar14;
            pbVar34 = target + 1;
            uVar33 = uVar28;
            if (0x7f < uVar28) {
              do {
                *pbVar34 = (byte)uVar33 | 0x80;
                uVar28 = uVar33 >> 7;
                pbVar34 = pbVar34 + 1;
                bVar7 = 0x3fff < uVar33;
                uVar33 = uVar28;
              } while (bVar7);
            }
            goto LAB_00264e4a;
          }
          pcVar29 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                              (bVar7,0xbf < bVar8,
                               "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,pcVar29);
          goto LAB_00266520;
        case '\x04':
          bVar8 = field->field_0x1;
          bVar7 = (bool)((bVar8 & 0x20) >> 5);
          if (0xbf < bVar8 == bVar7) {
            if ((bVar8 & 0x20) == 0) {
              uVar28 = Reflection::GetUInt64((Reflection *)pDVar31,message,field);
            }
            else {
              uVar28 = Reflection::GetRepeatedUInt64((Reflection *)pDVar31,message,field,iVar12);
            }
            uVar14 = field->number_ << 3;
            uVar9 = uVar14;
            if (0x7f < uVar14) {
              do {
                *target = (byte)uVar9 | 0x80;
                uVar14 = uVar9 >> 7;
                target = target + 1;
                bVar7 = 0x3fff < uVar9;
                uVar9 = uVar14;
              } while (bVar7);
            }
            *target = (byte)uVar14;
            pbVar34 = target + 1;
            uVar33 = uVar28;
            if (0x7f < uVar28) {
              do {
                *pbVar34 = (byte)uVar33 | 0x80;
                uVar28 = uVar33 >> 7;
                pbVar34 = pbVar34 + 1;
                bVar7 = 0x3fff < uVar33;
                uVar33 = uVar28;
              } while (bVar7);
            }
            goto LAB_00264e4a;
          }
          pcVar29 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                              (bVar7,0xbf < bVar8,
                               "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,pcVar29);
          goto LAB_00266520;
        case '\x05':
          bVar8 = field->field_0x1;
          bVar7 = (bool)((bVar8 & 0x20) >> 5);
          if (0xbf < bVar8 == bVar7) {
            if ((bVar8 & 0x20) == 0) {
              uVar9 = Reflection::GetInt32((Reflection *)pDVar31,message,field);
            }
            else {
              uVar9 = Reflection::GetRepeatedInt32((Reflection *)pDVar31,message,field,iVar12);
            }
            uVar30 = field->number_ << 3;
            uVar14 = uVar30;
            if (0x7f < uVar30) {
              do {
                *target = (byte)uVar14 | 0x80;
                uVar30 = uVar14 >> 7;
                target = target + 1;
                bVar7 = 0x3fff < uVar14;
                uVar14 = uVar30;
              } while (bVar7);
            }
            *target = (byte)uVar30;
            pbVar34 = target + 1;
            uVar28 = (ulong)(int)uVar9;
            uVar33 = uVar28;
            if (0x7f < uVar9) {
              do {
                *pbVar34 = (byte)uVar33 | 0x80;
                uVar28 = uVar33 >> 7;
                pbVar34 = pbVar34 + 1;
                bVar7 = 0x3fff < uVar33;
                uVar33 = uVar28;
              } while (bVar7);
            }
            *pbVar34 = (byte)uVar28;
            goto LAB_00264e4e;
          }
          pcVar29 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                              (bVar7,0xbf < bVar8,
                               "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,pcVar29);
          goto LAB_00266520;
        case '\x06':
          bVar8 = field->field_0x1;
          bVar7 = (bool)((bVar8 & 0x20) >> 5);
          if (0xbf < bVar8 == bVar7) {
            if ((bVar8 & 0x20) == 0) {
              uVar15 = Reflection::GetUInt64((Reflection *)pDVar31,message,field);
            }
            else {
              uVar15 = Reflection::GetRepeatedUInt64((Reflection *)pDVar31,message,field,iVar12);
            }
            uVar9 = field->number_ * 8 + 1;
            uVar33 = (ulong)uVar9;
            if ((uint)(field->number_ << 3) < 0x80) {
LAB_00264dfa:
              uVar33 = (ulong)uVar9;
            }
            else {
              do {
                uVar9 = (uint)uVar33;
                *target = (byte)uVar33 | 0x80;
                uVar33 = uVar33 >> 7;
                target = target + 1;
              } while (0x3fff < uVar9);
            }
            goto LAB_00264dfc;
          }
          pcVar29 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                              (bVar7,0xbf < bVar8,
                               "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,pcVar29);
          goto LAB_00266520;
        case '\a':
          bVar8 = field->field_0x1;
          v1 = (bVar8 & 0x20) >> 5;
          if (0xbf < bVar8 == (bool)v1) {
            if ((bVar8 & 0x20) == 0) {
              uVar10 = Reflection::GetUInt32((Reflection *)pDVar31,message,field);
            }
            else {
              uVar10 = Reflection::GetRepeatedUInt32((Reflection *)pDVar31,message,field,iVar12);
            }
            uVar9 = field->number_ * 8 + 5;
            uVar33 = (ulong)uVar9;
            if ((uint)(field->number_ << 3) < 0x80) {
LAB_00264e7e:
              uVar33 = (ulong)uVar9;
            }
            else {
              do {
                uVar9 = (uint)uVar33;
                *target = (byte)uVar33 | 0x80;
                uVar33 = uVar33 >> 7;
                target = target + 1;
              } while (0x3fff < uVar9);
            }
            goto LAB_00264e80;
          }
          goto LAB_002661db;
        case '\b':
          bVar8 = field->field_0x1;
          bVar7 = (bool)((bVar8 & 0x20) >> 5);
          if (0xbf < bVar8 != bVar7) {
            pcVar29 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar7,0xbf < bVar8,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_a0,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb54,pcVar29);
            goto LAB_00266520;
          }
          if ((bVar8 & 0x20) == 0) {
            bVar7 = Reflection::GetBool((Reflection *)pDVar31,message,field);
          }
          else {
            bVar7 = Reflection::GetRepeatedBool((Reflection *)pDVar31,message,field,iVar12);
          }
          uVar14 = field->number_ << 3;
          uVar9 = uVar14;
          if (0x7f < uVar14) {
            do {
              *target = (byte)uVar9 | 0x80;
              uVar14 = uVar9 >> 7;
              target = target + 1;
              bVar6 = 0x3fff < uVar9;
              uVar9 = uVar14;
            } while (bVar6);
          }
          *target = (byte)uVar14;
          target[1] = bVar7;
          target = target + 2;
          break;
        case '\t':
          FieldDescriptor::requires_utf8_validation(field);
          local_a0._0_8_ = local_90;
          local_a0._8_8_ =
               (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                )0x0;
          local_90[0] = '\0';
          bVar8 = field->field_0x1;
          bVar7 = (bool)((bVar8 & 0x20) >> 5);
          if (0xbf < bVar8 != bVar7) {
            pcVar29 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar7,0xbf < bVar8,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)
                       &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb54,pcVar29);
LAB_002665a5:
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)
                       &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep);
          }
          if ((bVar8 & 0x20) == 0) {
            psVar18 = Reflection::GetStringReference
                                ((Reflection *)pDVar31,message,field,(string *)local_a0);
          }
          else {
            psVar18 = Reflection::GetRepeatedStringReference
                                ((Reflection *)pDVar31,message,field,iVar12,(string *)local_a0);
          }
          pcVar4 = (field->all_names_).payload_;
          uVar3 = *(ushort *)(pcVar4 + 2);
          field_name._M_len = pcVar4 + ~(ulong)uVar3;
          field_name._M_str = in_R9;
          WireFormatLite::VerifyUtf8String
                    ((WireFormatLite *)(psVar18->_M_dataplus)._M_p,
                     (char *)(ulong)(uint)psVar18->_M_string_length,1,(uint)uVar3,field_name);
          sVar5 = psVar18->_M_string_length;
          if ((long)sVar5 < 0x80) {
            uVar9 = field->number_ * 8;
            lVar16 = 1;
            if (((0x7f < uVar9) && (lVar16 = 2, 0x3fff < uVar9)) && (lVar16 = 3, 0x1fffff < uVar9))
            {
              lVar16 = 5 - (ulong)(uVar9 < 0x10000000);
            }
            if ((long)(stream->end_ + ~(ulong)(target + lVar16) + 0x10) < (long)sVar5)
            goto LAB_00265128;
            uVar30 = uVar9 | 2;
            uVar14 = uVar30;
            if (0x7f < uVar9) {
              do {
                *target = (byte)uVar14 | 0x80;
                uVar30 = uVar14 >> 7;
                target = target + 1;
                bVar7 = 0x3fff < uVar14;
                uVar14 = uVar30;
              } while (bVar7);
            }
            *target = (byte)uVar30;
            target[1] = (byte)sVar5;
            memcpy(target + 2,(psVar18->_M_dataplus)._M_p,sVar5);
            target = target + sVar5 + 2;
          }
          else {
LAB_00265128:
            s._M_str = (psVar18->_M_dataplus)._M_p;
            s._M_len = sVar5;
            target = io::EpsCopyOutputStream::WriteStringOutline(stream,field->number_,s,target);
          }
          pDVar31 = local_50;
          message = (Message *)local_40;
          if ((Descriptor *)local_a0._0_8_ != (Descriptor *)local_90) {
LAB_00265073:
            pDVar31 = local_50;
            operator_delete((void *)local_a0._0_8_,CONCAT71(local_90._1_7_,local_90[0]) + 1);
          }
          break;
        case '\n':
          bVar8 = field->field_0x1;
          bVar7 = (bool)((bVar8 & 0x20) >> 5);
          if (0xbf < bVar8 != bVar7) {
            pcVar29 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar7,0xbf < bVar8,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_a0,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb54,pcVar29);
            goto LAB_00266520;
          }
          if ((bVar8 & 0x20) == 0) {
            pMVar19 = &Reflection::GetMessage
                                 ((Reflection *)pDVar31,message,field,(MessageFactory *)0x0)->
                       super_MessageLite;
          }
          else if ((tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                    )local_f8 ==
                   (_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                    )local_48._M_t.
                     super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                     .
                     super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                     ._M_head_impl) {
            pMVar19 = &Reflection::GetRepeatedMessage((Reflection *)pDVar31,message,field,iVar12)->
                       super_MessageLite;
          }
          else {
            pMVar19 = *(MessageLite **)((long)&local_f8->entry + lVar32 * 8);
          }
          target = WireFormatLite::InternalWriteGroup(field->number_,pMVar19,target,stream);
          break;
        case '\v':
          bVar8 = field->field_0x1;
          bVar7 = (bool)((bVar8 & 0x20) >> 5);
          if (0xbf < bVar8 != bVar7) {
            pcVar29 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar7,0xbf < bVar8,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_a0,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb54,pcVar29);
            goto LAB_00266520;
          }
          if ((bVar8 & 0x20) == 0) {
            pMVar19 = &Reflection::GetMessage
                                 ((Reflection *)pDVar31,message,field,(MessageFactory *)0x0)->
                       super_MessageLite;
          }
          else if ((tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                    )local_f8 ==
                   (_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                    )local_48._M_t.
                     super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                     .
                     super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                     ._M_head_impl) {
            pMVar19 = &Reflection::GetRepeatedMessage
                                 ((Reflection *)pDVar31,(Message *)local_40,field,iVar12)->
                       super_MessageLite;
          }
          else {
            pMVar19 = *(MessageLite **)((long)&local_f8->entry + lVar32 * 8);
          }
          iVar12 = field->number_;
          iVar13 = MessageLite::GetCachedSize(pMVar19);
          target = WireFormatLite::InternalWriteMessage(iVar12,pMVar19,iVar13,target,stream);
          pDVar31 = local_50;
          message = (Message *)local_40;
          break;
        case '\f':
          CVar11 = FieldDescriptor::cpp_string_type(field);
          if (CVar11 == kCord) {
            Reflection::GetCord((Reflection *)local_a0,(Message *)pDVar31,(FieldDescriptor *)message
                               );
            target = io::EpsCopyOutputStream::WriteString
                               (stream,field->number_,(Cord *)local_a0,target);
            absl::lts_20250127::Cord::~Cord((Cord *)local_a0);
          }
          else {
            local_a0._0_8_ = local_90;
            local_a0._8_8_ =
                 (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                  )0x0;
            local_90[0] = '\0';
            bVar8 = field->field_0x1;
            bVar7 = (bool)((bVar8 & 0x20) >> 5);
            if (0xbf < bVar8 != bVar7) {
              pcVar29 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                  (bVar7,0xbf < bVar8,
                                   "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)
                         &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xb54,pcVar29);
              goto LAB_002665a5;
            }
            if ((bVar8 & 0x20) == 0) {
              psVar18 = Reflection::GetStringReference
                                  ((Reflection *)pDVar31,message,field,(string *)local_a0);
            }
            else {
              psVar18 = Reflection::GetRepeatedStringReference
                                  ((Reflection *)pDVar31,message,field,iVar12,(string *)local_a0);
            }
            sVar5 = psVar18->_M_string_length;
            if ((long)sVar5 < 0x80) {
              uVar9 = field->number_ * 8;
              lVar16 = 1;
              if (((0x7f < uVar9) && (lVar16 = 2, 0x3fff < uVar9)) && (lVar16 = 3, 0x1fffff < uVar9)
                 ) {
                lVar16 = 5 - (ulong)(uVar9 < 0x10000000);
              }
              if ((long)(stream->end_ + ~(ulong)(target + lVar16) + 0x10) < (long)sVar5)
              goto LAB_00265368;
              uVar30 = uVar9 | 2;
              uVar14 = uVar30;
              if (0x7f < uVar9) {
                do {
                  *target = (byte)uVar14 | 0x80;
                  uVar30 = uVar14 >> 7;
                  target = target + 1;
                  bVar7 = 0x3fff < uVar14;
                  uVar14 = uVar30;
                } while (bVar7);
              }
              *target = (byte)uVar30;
              target[1] = (byte)sVar5;
              memcpy(target + 2,(psVar18->_M_dataplus)._M_p,sVar5);
              target = target + sVar5 + 2;
            }
            else {
LAB_00265368:
              s_00._M_str = (psVar18->_M_dataplus)._M_p;
              s_00._M_len = sVar5;
              target = io::EpsCopyOutputStream::WriteStringOutline
                                 (stream,field->number_,s_00,target);
            }
            pDVar31 = local_50;
            if ((Descriptor *)local_a0._0_8_ != (Descriptor *)local_90) goto LAB_00265073;
          }
          break;
        case '\r':
          bVar8 = field->field_0x1;
          bVar7 = (bool)((bVar8 & 0x20) >> 5);
          if (0xbf < bVar8 == bVar7) {
            if ((bVar8 & 0x20) == 0) {
              uVar14 = Reflection::GetUInt32((Reflection *)pDVar31,message,field);
            }
            else {
              uVar14 = Reflection::GetRepeatedUInt32((Reflection *)pDVar31,message,field,iVar12);
            }
            uVar30 = field->number_ << 3;
            uVar9 = uVar30;
            if (0x7f < uVar30) {
              do {
                *target = (byte)uVar9 | 0x80;
                uVar30 = uVar9 >> 7;
                target = target + 1;
                bVar7 = 0x3fff < uVar9;
                uVar9 = uVar30;
              } while (bVar7);
            }
            *target = (byte)uVar30;
            pbVar34 = target + 1;
            uVar9 = uVar14;
            if (0x7f < uVar14) {
              do {
                *pbVar34 = (byte)uVar9 | 0x80;
                uVar14 = uVar9 >> 7;
                pbVar34 = pbVar34 + 1;
                bVar7 = 0x3fff < uVar9;
                uVar9 = uVar14;
              } while (bVar7);
            }
            goto LAB_00264bac;
          }
          pcVar29 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                              (bVar7,0xbf < bVar8,
                               "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,pcVar29);
          goto LAB_00266520;
        case '\x0e':
          bVar8 = field->field_0x1;
          bVar7 = (bool)((bVar8 & 0x20) >> 5);
          if (0xbf < bVar8 == bVar7) {
            if ((bVar8 & 0x20) == 0) {
              pEVar17 = Reflection::GetEnum((Reflection *)pDVar31,message,field);
            }
            else {
              pEVar17 = Reflection::GetRepeatedEnum((Reflection *)pDVar31,message,field,iVar12);
            }
            uVar9 = pEVar17->number_;
            uVar28 = (ulong)(int)uVar9;
            uVar30 = field->number_ << 3;
            uVar14 = uVar30;
            if (0x7f < uVar30) {
              do {
                *target = (byte)uVar14 | 0x80;
                uVar30 = uVar14 >> 7;
                target = target + 1;
                bVar7 = 0x3fff < uVar14;
                uVar14 = uVar30;
              } while (bVar7);
            }
            *target = (byte)uVar30;
            pbVar34 = target + 1;
            uVar33 = uVar28;
            if (0x7f < uVar9) {
              do {
                *pbVar34 = (byte)uVar33 | 0x80;
                uVar28 = uVar33 >> 7;
                pbVar34 = pbVar34 + 1;
                bVar7 = 0x3fff < uVar33;
                uVar33 = uVar28;
              } while (bVar7);
            }
            goto LAB_00264e4a;
          }
          pcVar29 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                              (bVar7,0xbf < bVar8,
                               "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,pcVar29);
          goto LAB_00266520;
        case '\x0f':
          bVar8 = field->field_0x1;
          bVar7 = (bool)((bVar8 & 0x20) >> 5);
          if (0xbf < bVar8 != bVar7) {
            pcVar29 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar7,0xbf < bVar8,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_a0,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb54,pcVar29);
            goto LAB_00266520;
          }
          if ((bVar8 & 0x20) == 0) {
            uVar10 = Reflection::GetInt32((Reflection *)pDVar31,message,field);
          }
          else {
            uVar10 = Reflection::GetRepeatedInt32((Reflection *)pDVar31,message,field,iVar12);
          }
          uVar9 = field->number_ * 8 + 5;
          if ((uint)(field->number_ << 3) < 0x80) goto LAB_00264e7e;
          uVar33 = (ulong)uVar9;
          do {
            uVar9 = (uint)uVar33;
            *target = (byte)uVar33 | 0x80;
            uVar33 = uVar33 >> 7;
            target = target + 1;
          } while (0x3fff < uVar9);
LAB_00264e80:
          *target = (byte)uVar33;
          *(uint32_t *)(target + 1) = uVar10;
LAB_00264e89:
          target = target + 5;
          break;
        case '\x10':
          bVar8 = field->field_0x1;
          bVar7 = (bool)((bVar8 & 0x20) >> 5);
          if (0xbf < bVar8 != bVar7) {
            pcVar29 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar7,0xbf < bVar8,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_a0,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb54,pcVar29);
            goto LAB_00266520;
          }
          if ((bVar8 & 0x20) == 0) {
            uVar15 = Reflection::GetInt64((Reflection *)pDVar31,message,field);
          }
          else {
            uVar15 = Reflection::GetRepeatedInt64((Reflection *)pDVar31,message,field,iVar12);
          }
          uVar9 = field->number_ * 8 + 1;
          if ((uint)(field->number_ << 3) < 0x80) goto LAB_00264dfa;
          uVar33 = (ulong)uVar9;
          do {
            uVar9 = (uint)uVar33;
            *target = (byte)uVar33 | 0x80;
            uVar33 = uVar33 >> 7;
            target = target + 1;
          } while (0x3fff < uVar9);
LAB_00264dfc:
          *target = (byte)uVar33;
          *(uint64_t *)(target + 1) = uVar15;
LAB_00264e05:
          target = target + 9;
          break;
        case '\x11':
          bVar8 = field->field_0x1;
          bVar7 = (bool)((bVar8 & 0x20) >> 5);
          if (0xbf < bVar8 == bVar7) {
            if ((bVar8 & 0x20) == 0) {
              iVar12 = Reflection::GetInt32((Reflection *)pDVar31,message,field);
            }
            else {
              iVar12 = Reflection::GetRepeatedInt32((Reflection *)pDVar31,message,field,iVar12);
            }
            uVar14 = field->number_ << 3;
            uVar9 = uVar14;
            if (0x7f < uVar14) {
              do {
                *target = (byte)uVar9 | 0x80;
                uVar14 = uVar9 >> 7;
                target = target + 1;
                bVar7 = 0x3fff < uVar9;
                uVar9 = uVar14;
              } while (bVar7);
            }
            *target = (byte)uVar14;
            pbVar34 = target + 1;
            uVar14 = iVar12 >> 0x1f ^ iVar12 * 2;
            uVar9 = uVar14;
            if (0x7f < uVar14) {
              do {
                *pbVar34 = (byte)uVar9 | 0x80;
                uVar14 = uVar9 >> 7;
                pbVar34 = pbVar34 + 1;
                bVar7 = 0x3fff < uVar9;
                uVar9 = uVar14;
              } while (bVar7);
            }
LAB_00264bac:
            *pbVar34 = (byte)uVar14;
            goto LAB_00264e4e;
          }
          pcVar29 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                              (bVar7,0xbf < bVar8,
                               "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,pcVar29);
          goto LAB_00266520;
        case '\x12':
          bVar8 = field->field_0x1;
          bVar7 = (bool)((bVar8 & 0x20) >> 5);
          if (0xbf < bVar8 != bVar7) {
            pcVar29 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar7,0xbf < bVar8,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_a0,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb54,pcVar29);
            goto LAB_00266520;
          }
          if ((bVar8 & 0x20) == 0) {
            lVar16 = Reflection::GetInt64((Reflection *)pDVar31,message,field);
          }
          else {
            lVar16 = Reflection::GetRepeatedInt64((Reflection *)pDVar31,message,field,iVar12);
          }
          uVar14 = field->number_ << 3;
          uVar9 = uVar14;
          if (0x7f < uVar14) {
            do {
              *target = (byte)uVar9 | 0x80;
              uVar14 = uVar9 >> 7;
              target = target + 1;
              bVar7 = 0x3fff < uVar9;
              uVar9 = uVar14;
            } while (bVar7);
          }
          *target = (byte)uVar14;
          pbVar34 = target + 1;
          uVar28 = lVar16 >> 0x3f ^ lVar16 * 2;
          uVar33 = uVar28;
          if (0x7f < uVar28) {
            do {
              *pbVar34 = (byte)uVar33 | 0x80;
              uVar28 = uVar33 >> 7;
              pbVar34 = pbVar34 + 1;
              bVar7 = 0x3fff < uVar33;
              uVar33 = uVar28;
            } while (bVar7);
          }
LAB_00264e4a:
          *pbVar34 = (byte)uVar28;
LAB_00264e4e:
          target = pbVar34 + 1;
        }
        lVar32 = lVar32 + 1;
      } while ((EnumDescriptor *)lVar32 != local_38);
    }
    goto LAB_00266198;
  }
  if (uVar9 == 0) goto LAB_00266198;
  if (stream->end_ <= target) {
    target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
  }
  switch(field->type_) {
  case '\x01':
    rhs = Reflection::GetRepeatedFieldInternal<double>((Reflection *)pDVar31,message,field);
    RepeatedField<double>::RepeatedField
              ((RepeatedField<double> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep,(Arena *)0x0,rhs);
    iVar12 = field->number_;
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar13 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep,
                          (local_e8._0_8_ & 4) == 0);
    if (stream->end_ <= target) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00266520;
    }
    uVar9 = iVar13 << 3;
    uVar33 = (ulong)(iVar12 * 8 + 2);
    if (0x7f < (uint)(iVar12 << 3)) {
      do {
        uVar14 = (uint)uVar33;
        *target = (byte)uVar33 | 0x80;
        uVar33 = uVar33 >> 7;
        target = target + 1;
      } while (0x3fff < uVar14);
    }
    *target = (byte)uVar33;
    pbVar34 = target + 1;
    uVar14 = uVar9;
    uVar30 = uVar9;
    if (0x7f < uVar9) {
      do {
        target = pbVar34;
        *target = (byte)uVar30 | 0x80;
        uVar14 = uVar30 >> 7;
        pbVar34 = target + 1;
        bVar7 = 0x3fff < uVar30;
        uVar30 = uVar14;
      } while (bVar7);
    }
    *pbVar34 = (byte)uVar14;
    if ((local_e8._0_8_ & 4) == 0) {
      piVar26 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep).size;
    }
    else {
      piVar26 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep);
    }
    pbVar34 = target + 2;
    if ((long)stream->end_ - (long)pbVar34 < (long)(int)uVar9) {
      target = io::EpsCopyOutputStream::WriteRawFallback(stream,piVar26,uVar9,pbVar34);
    }
    else {
      memcpy(pbVar34,piVar26,(ulong)uVar9);
      target = pbVar34 + (int)uVar9;
    }
    RepeatedField<double>::~RepeatedField
              ((RepeatedField<double> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep);
    break;
  case '\x02':
    rhs_00 = Reflection::GetRepeatedFieldInternal<float>((Reflection *)pDVar31,message,field);
    RepeatedField<float>::RepeatedField
              ((RepeatedField<float> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep,(Arena *)0x0,rhs_00);
    iVar12 = field->number_;
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar13 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep,
                          (local_e8._0_8_ & 4) == 0);
    if (stream->end_ <= target) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00266520;
    }
    uVar9 = iVar13 << 2;
    uVar33 = (ulong)(iVar12 * 8 + 2);
    if (0x7f < (uint)(iVar12 << 3)) {
      do {
        uVar14 = (uint)uVar33;
        *target = (byte)uVar33 | 0x80;
        uVar33 = uVar33 >> 7;
        target = target + 1;
      } while (0x3fff < uVar14);
    }
    *target = (byte)uVar33;
    pbVar34 = target + 1;
    uVar14 = uVar9;
    uVar30 = uVar9;
    if (0x7f < uVar9) {
      do {
        target = pbVar34;
        *target = (byte)uVar30 | 0x80;
        uVar14 = uVar30 >> 7;
        pbVar34 = target + 1;
        bVar7 = 0x3fff < uVar30;
        uVar30 = uVar14;
      } while (bVar7);
    }
    *pbVar34 = (byte)uVar14;
    if ((local_e8._0_8_ & 4) == 0) {
      piVar26 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep).size;
    }
    else {
      piVar26 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep);
    }
    pbVar34 = target + 2;
    if ((long)stream->end_ - (long)pbVar34 < (long)(int)uVar9) {
      target = io::EpsCopyOutputStream::WriteRawFallback(stream,piVar26,uVar9,pbVar34);
    }
    else {
      memcpy(pbVar34,piVar26,(ulong)uVar9);
      target = pbVar34 + (int)uVar9;
    }
    RepeatedField<float>::~RepeatedField
              ((RepeatedField<float> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep);
    break;
  case '\x03':
    pRVar23 = Reflection::GetRepeatedFieldInternal<long>((Reflection *)pDVar31,message,field);
    RepeatedField<long>::RepeatedField
              ((RepeatedField<long> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep
               ,(Arena *)0x0,pRVar23);
    iVar12 = field->number_;
    sVar24 = FieldDataOnlyByteSize(field,message);
    pbVar34 = stream->end_;
    if (pbVar34 <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pbVar34 = stream->end_;
    }
    if (pbVar34 <= target) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00266520;
    }
    uVar33 = (ulong)(iVar12 * 8 + 2);
    if (0x7f < (uint)(iVar12 << 3)) {
      do {
        uVar9 = (uint)uVar33;
        *target = (byte)uVar33 | 0x80;
        uVar33 = uVar33 >> 7;
        target = target + 1;
      } while (0x3fff < uVar9);
    }
    *target = (byte)uVar33;
    pbVar34 = target + 1;
    if (0x7f < (uint)sVar24) {
      do {
        target = pbVar34;
        uVar9 = (uint)sVar24;
        *target = (byte)sVar24 | 0x80;
        sVar24 = (size_t)(uVar9 >> 7);
        pbVar34 = target + 1;
      } while (0x3fff < uVar9);
    }
    *pbVar34 = (byte)sVar24;
    if ((local_e8._0_8_ & 4) == 0) {
      bVar7 = true;
      paVar27 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->short_rep).field_1;
    }
    else {
      paVar27 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1 *)
                LongSooRep::elements(&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep)
      ;
      bVar7 = (local_e8._0_8_ & 4) == 0;
    }
    iVar12 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep,
                          bVar7);
    target = target + 2;
    paVar2 = paVar27 + iVar12;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar33 = *(ulong *)paVar27->data;
      uVar28 = uVar33;
      if (0x7f < uVar33) {
        do {
          *target = (byte)uVar28 | 0x80;
          uVar33 = uVar28 >> 7;
          target = target + 1;
          bVar7 = 0x3fff < uVar28;
          uVar28 = uVar33;
        } while (bVar7);
      }
      paVar27 = paVar27 + 1;
      *target = (byte)uVar33;
      target = target + 1;
    } while (paVar27 < paVar2);
    goto LAB_00265c6f;
  case '\x04':
    pRVar25 = Reflection::GetRepeatedFieldInternal<unsigned_long>
                        ((Reflection *)pDVar31,message,field);
    RepeatedField<unsigned_long>::RepeatedField
              ((RepeatedField<unsigned_long> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep,(Arena *)0x0,pRVar25);
    iVar12 = field->number_;
    sVar24 = FieldDataOnlyByteSize(field,message);
    pbVar34 = stream->end_;
    if (pbVar34 <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pbVar34 = stream->end_;
    }
    if (pbVar34 <= target) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00266520;
    }
    uVar33 = (ulong)(iVar12 * 8 + 2);
    if (0x7f < (uint)(iVar12 << 3)) {
      do {
        uVar9 = (uint)uVar33;
        *target = (byte)uVar33 | 0x80;
        uVar33 = uVar33 >> 7;
        target = target + 1;
      } while (0x3fff < uVar9);
    }
    *target = (byte)uVar33;
    pbVar34 = target + 1;
    if (0x7f < (uint)sVar24) {
      do {
        target = pbVar34;
        uVar9 = (uint)sVar24;
        *target = (byte)sVar24 | 0x80;
        sVar24 = (size_t)(uVar9 >> 7);
        pbVar34 = target + 1;
      } while (0x3fff < uVar9);
    }
    *pbVar34 = (byte)sVar24;
    if ((local_e8._0_8_ & 4) == 0) {
      bVar7 = true;
      paVar27 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->short_rep).field_1;
    }
    else {
      paVar27 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1 *)
                LongSooRep::elements(&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep)
      ;
      bVar7 = (local_e8._0_8_ & 4) == 0;
    }
    iVar12 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep,
                          bVar7);
    target = target + 2;
    paVar2 = paVar27 + iVar12;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar33 = *(ulong *)paVar27->data;
      uVar28 = uVar33;
      if (0x7f < uVar33) {
        do {
          *target = (byte)uVar28 | 0x80;
          uVar33 = uVar28 >> 7;
          target = target + 1;
          bVar7 = 0x3fff < uVar28;
          uVar28 = uVar33;
        } while (bVar7);
      }
      paVar27 = paVar27 + 1;
      *target = (byte)uVar33;
      target = target + 1;
    } while (paVar27 < paVar2);
    goto LAB_00265fc8;
  case '\x05':
    pRVar21 = Reflection::GetRepeatedFieldInternal<int>((Reflection *)pDVar31,message,field);
    RepeatedField<int>::RepeatedField
              ((RepeatedField<int> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep,
               (Arena *)0x0,pRVar21);
    iVar12 = field->number_;
    sVar24 = FieldDataOnlyByteSize(field,message);
    pbVar34 = stream->end_;
    if (pbVar34 <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pbVar34 = stream->end_;
    }
    if (pbVar34 <= target) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00266520;
    }
    uVar33 = (ulong)(iVar12 * 8 + 2);
    if (0x7f < (uint)(iVar12 << 3)) {
      do {
        uVar9 = (uint)uVar33;
        *target = (byte)uVar33 | 0x80;
        uVar33 = uVar33 >> 7;
        target = target + 1;
      } while (0x3fff < uVar9);
    }
    *target = (byte)uVar33;
    pbVar34 = target + 1;
    if (0x7f < (uint)sVar24) {
      do {
        target = pbVar34;
        uVar9 = (uint)sVar24;
        *target = (byte)sVar24 | 0x80;
        sVar24 = (size_t)(uVar9 >> 7);
        pbVar34 = target + 1;
      } while (0x3fff < uVar9);
    }
    *pbVar34 = (byte)sVar24;
    if ((local_e8._0_8_ & 4) == 0) {
      bVar7 = true;
      piVar26 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep).size;
    }
    else {
      piVar26 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep);
      bVar7 = (local_e8._0_8_ & 4) == 0;
    }
    iVar12 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep,
                          bVar7);
    target = target + 2;
    piVar1 = piVar26 + iVar12;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar28 = (ulong)*piVar26;
      uVar33 = uVar28;
      if (0x7f < uVar28) {
        do {
          *target = (byte)uVar33 | 0x80;
          uVar28 = uVar33 >> 7;
          target = target + 1;
          bVar7 = 0x3fff < uVar33;
          uVar33 = uVar28;
        } while (bVar7);
      }
      piVar26 = piVar26 + 1;
      *target = (byte)uVar28;
      target = target + 1;
    } while (piVar26 < piVar1);
    goto LAB_00265db6;
  case '\x06':
    pRVar25 = Reflection::GetRepeatedFieldInternal<unsigned_long>
                        ((Reflection *)pDVar31,message,field);
    RepeatedField<unsigned_long>::RepeatedField
              ((RepeatedField<unsigned_long> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep,(Arena *)0x0,pRVar25);
    iVar12 = field->number_;
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar13 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep,
                          (local_e8._0_8_ & 4) == 0);
    if (stream->end_ <= target) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00266520;
    }
    uVar9 = iVar13 << 3;
    uVar33 = (ulong)(iVar12 * 8 + 2);
    if (0x7f < (uint)(iVar12 << 3)) {
      do {
        uVar14 = (uint)uVar33;
        *target = (byte)uVar33 | 0x80;
        uVar33 = uVar33 >> 7;
        target = target + 1;
      } while (0x3fff < uVar14);
    }
    *target = (byte)uVar33;
    pbVar34 = target + 1;
    uVar14 = uVar9;
    uVar30 = uVar9;
    if (0x7f < uVar9) {
      do {
        target = pbVar34;
        *target = (byte)uVar30 | 0x80;
        uVar14 = uVar30 >> 7;
        pbVar34 = target + 1;
        bVar7 = 0x3fff < uVar30;
        uVar30 = uVar14;
      } while (bVar7);
    }
    *pbVar34 = (byte)uVar14;
    if ((local_e8._0_8_ & 4) == 0) {
      piVar26 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep).size;
    }
    else {
      piVar26 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep);
    }
    pbVar34 = target + 2;
    if ((long)stream->end_ - (long)pbVar34 < (long)(int)uVar9) {
      target = io::EpsCopyOutputStream::WriteRawFallback(stream,piVar26,uVar9,pbVar34);
    }
    else {
      memcpy(pbVar34,piVar26,(ulong)uVar9);
      target = pbVar34 + (int)uVar9;
    }
LAB_00265fc8:
    RepeatedField<unsigned_long>::~RepeatedField
              ((RepeatedField<unsigned_long> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep);
    break;
  case '\a':
    pRVar22 = Reflection::GetRepeatedFieldInternal<unsigned_int>
                        ((Reflection *)pDVar31,message,field);
    RepeatedField<unsigned_int>::RepeatedField
              ((RepeatedField<unsigned_int> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep,(Arena *)0x0,pRVar22);
    iVar12 = field->number_;
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar13 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep,
                          (local_e8._0_8_ & 4) == 0);
    if (stream->end_ <= target) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00266520;
    }
    uVar9 = iVar13 << 2;
    uVar33 = (ulong)(iVar12 * 8 + 2);
    if (0x7f < (uint)(iVar12 << 3)) {
      do {
        uVar14 = (uint)uVar33;
        *target = (byte)uVar33 | 0x80;
        uVar33 = uVar33 >> 7;
        target = target + 1;
      } while (0x3fff < uVar14);
    }
    *target = (byte)uVar33;
    pbVar34 = target + 1;
    uVar14 = uVar9;
    uVar30 = uVar9;
    if (0x7f < uVar9) {
      do {
        target = pbVar34;
        *target = (byte)uVar30 | 0x80;
        uVar14 = uVar30 >> 7;
        pbVar34 = target + 1;
        bVar7 = 0x3fff < uVar30;
        uVar30 = uVar14;
      } while (bVar7);
    }
    *pbVar34 = (byte)uVar14;
    if ((local_e8._0_8_ & 4) == 0) {
      piVar26 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep).size;
    }
    else {
      piVar26 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep);
    }
    pbVar34 = target + 2;
    if ((long)stream->end_ - (long)pbVar34 < (long)(int)uVar9) {
      target = io::EpsCopyOutputStream::WriteRawFallback(stream,piVar26,uVar9,pbVar34);
    }
    else {
      memcpy(pbVar34,piVar26,(ulong)uVar9);
      target = pbVar34 + (int)uVar9;
    }
    goto LAB_0026618e;
  case '\b':
    rhs_01 = Reflection::GetRepeatedFieldInternal<bool>((Reflection *)pDVar31,message,field);
    RepeatedField<bool>::RepeatedField
              ((RepeatedField<bool> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep
               ,(Arena *)0x0,rhs_01);
    iVar12 = field->number_;
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar9 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep,
                         (local_e8._0_8_ & 4) == 0);
    if (stream->end_ <= target) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00266520;
    }
    uVar33 = (ulong)(iVar12 * 8 + 2);
    if (0x7f < (uint)(iVar12 << 3)) {
      do {
        uVar14 = (uint)uVar33;
        *target = (byte)uVar33 | 0x80;
        uVar33 = uVar33 >> 7;
        target = target + 1;
      } while (0x3fff < uVar14);
    }
    *target = (byte)uVar33;
    pbVar34 = target + 1;
    uVar14 = uVar9;
    uVar30 = uVar9;
    if (0x7f < uVar9) {
      do {
        target = pbVar34;
        *target = (byte)uVar30 | 0x80;
        uVar14 = uVar30 >> 7;
        pbVar34 = target + 1;
        bVar7 = 0x3fff < uVar30;
        uVar30 = uVar14;
      } while (bVar7);
    }
    *pbVar34 = (byte)uVar14;
    if ((local_e8._0_8_ & 4) == 0) {
      piVar26 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep).size;
    }
    else {
      piVar26 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep);
    }
    pbVar34 = target + 2;
    if ((long)stream->end_ - (long)pbVar34 < (long)(int)uVar9) {
      target = io::EpsCopyOutputStream::WriteRawFallback(stream,piVar26,uVar9,pbVar34);
    }
    else {
      memcpy(pbVar34,piVar26,(ulong)uVar9);
      target = pbVar34 + (int)uVar9;
    }
    RepeatedField<bool>::~RepeatedField
              ((RepeatedField<bool> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep
              );
    break;
  default:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_a0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.cc"
               ,0x522);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              ((LogMessage *)local_a0,(char (*) [19])"Invalid descriptor");
    goto LAB_00266520;
  case '\r':
    pRVar22 = Reflection::GetRepeatedFieldInternal<unsigned_int>
                        ((Reflection *)pDVar31,message,field);
    RepeatedField<unsigned_int>::RepeatedField
              ((RepeatedField<unsigned_int> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep,(Arena *)0x0,pRVar22);
    iVar12 = field->number_;
    sVar24 = FieldDataOnlyByteSize(field,message);
    pbVar34 = stream->end_;
    if (pbVar34 <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pbVar34 = stream->end_;
    }
    if (pbVar34 <= target) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00266520;
    }
    uVar33 = (ulong)(iVar12 * 8 + 2);
    if (0x7f < (uint)(iVar12 << 3)) {
      do {
        uVar9 = (uint)uVar33;
        *target = (byte)uVar33 | 0x80;
        uVar33 = uVar33 >> 7;
        target = target + 1;
      } while (0x3fff < uVar9);
    }
    *target = (byte)uVar33;
    pbVar34 = target + 1;
    if (0x7f < (uint)sVar24) {
      do {
        target = pbVar34;
        uVar9 = (uint)sVar24;
        *target = (byte)sVar24 | 0x80;
        sVar24 = (size_t)(uVar9 >> 7);
        pbVar34 = target + 1;
      } while (0x3fff < uVar9);
    }
    *pbVar34 = (byte)sVar24;
    if ((local_e8._0_8_ & 4) == 0) {
      bVar7 = true;
      piVar26 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep).size;
    }
    else {
      piVar26 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep);
      bVar7 = (local_e8._0_8_ & 4) == 0;
    }
    iVar12 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep,
                          bVar7);
    target = target + 2;
    piVar1 = piVar26 + iVar12;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar9 = *piVar26;
      uVar14 = uVar9;
      if (0x7f < uVar9) {
        do {
          *target = (byte)uVar14 | 0x80;
          uVar9 = uVar14 >> 7;
          target = target + 1;
          bVar7 = 0x3fff < uVar14;
          uVar14 = uVar9;
        } while (bVar7);
      }
      piVar26 = piVar26 + 1;
      *target = (byte)uVar9;
      target = target + 1;
    } while (piVar26 < piVar1);
LAB_0026618e:
    RepeatedField<unsigned_int>::~RepeatedField
              ((RepeatedField<unsigned_int> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep);
    break;
  case '\x0e':
    pRVar21 = Reflection::GetRepeatedFieldInternal<int>((Reflection *)pDVar31,message,field);
    RepeatedField<int>::RepeatedField
              ((RepeatedField<int> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep,
               (Arena *)0x0,pRVar21);
    iVar12 = field->number_;
    sVar24 = FieldDataOnlyByteSize(field,message);
    pbVar34 = stream->end_;
    if (pbVar34 <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pbVar34 = stream->end_;
    }
    if (pbVar34 <= target) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00266520;
    }
    uVar33 = (ulong)(iVar12 * 8 + 2);
    if (0x7f < (uint)(iVar12 << 3)) {
      do {
        uVar9 = (uint)uVar33;
        *target = (byte)uVar33 | 0x80;
        uVar33 = uVar33 >> 7;
        target = target + 1;
      } while (0x3fff < uVar9);
    }
    *target = (byte)uVar33;
    pbVar34 = target + 1;
    if (0x7f < (uint)sVar24) {
      do {
        target = pbVar34;
        uVar9 = (uint)sVar24;
        *target = (byte)sVar24 | 0x80;
        sVar24 = (size_t)(uVar9 >> 7);
        pbVar34 = target + 1;
      } while (0x3fff < uVar9);
    }
    *pbVar34 = (byte)sVar24;
    if ((local_e8._0_8_ & 4) == 0) {
      bVar7 = true;
      piVar26 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep).size;
    }
    else {
      piVar26 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep);
      bVar7 = (local_e8._0_8_ & 4) == 0;
    }
    iVar12 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep,
                          bVar7);
    target = target + 2;
    piVar1 = piVar26 + iVar12;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar28 = (ulong)*piVar26;
      uVar33 = uVar28;
      if (0x7f < uVar28) {
        do {
          *target = (byte)uVar33 | 0x80;
          uVar28 = uVar33 >> 7;
          target = target + 1;
          bVar7 = 0x3fff < uVar33;
          uVar33 = uVar28;
        } while (bVar7);
      }
      piVar26 = piVar26 + 1;
      *target = (byte)uVar28;
      target = target + 1;
    } while (piVar26 < piVar1);
    goto LAB_00265db6;
  case '\x0f':
    pRVar21 = Reflection::GetRepeatedFieldInternal<int>((Reflection *)pDVar31,message,field);
    RepeatedField<int>::RepeatedField
              ((RepeatedField<int> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep,
               (Arena *)0x0,pRVar21);
    iVar12 = field->number_;
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar13 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep,
                          (local_e8._0_8_ & 4) == 0);
    if (stream->end_ <= target) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00266520;
    }
    uVar9 = iVar13 << 2;
    uVar33 = (ulong)(iVar12 * 8 + 2);
    if (0x7f < (uint)(iVar12 << 3)) {
      do {
        uVar14 = (uint)uVar33;
        *target = (byte)uVar33 | 0x80;
        uVar33 = uVar33 >> 7;
        target = target + 1;
      } while (0x3fff < uVar14);
    }
    *target = (byte)uVar33;
    pbVar34 = target + 1;
    uVar14 = uVar9;
    uVar30 = uVar9;
    if (0x7f < uVar9) {
      do {
        target = pbVar34;
        *target = (byte)uVar30 | 0x80;
        uVar14 = uVar30 >> 7;
        pbVar34 = target + 1;
        bVar7 = 0x3fff < uVar30;
        uVar30 = uVar14;
      } while (bVar7);
    }
    *pbVar34 = (byte)uVar14;
    if ((local_e8._0_8_ & 4) == 0) {
      piVar26 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep).size;
    }
    else {
      piVar26 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep);
    }
    pbVar34 = target + 2;
    if ((long)stream->end_ - (long)pbVar34 < (long)(int)uVar9) {
      target = io::EpsCopyOutputStream::WriteRawFallback(stream,piVar26,uVar9,pbVar34);
    }
    else {
      memcpy(pbVar34,piVar26,(ulong)uVar9);
      target = pbVar34 + (int)uVar9;
    }
    goto LAB_00265db6;
  case '\x10':
    pRVar23 = Reflection::GetRepeatedFieldInternal<long>((Reflection *)pDVar31,message,field);
    RepeatedField<long>::RepeatedField
              ((RepeatedField<long> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep
               ,(Arena *)0x0,pRVar23);
    uVar9 = field->number_;
    pDVar31 = (DescriptorPool *)(ulong)uVar9;
    message = (Message *)stream;
    if (stream->end_ <= target) goto LAB_002665c4;
    goto LAB_002654dd;
  case '\x11':
    pRVar21 = Reflection::GetRepeatedFieldInternal<int>((Reflection *)pDVar31,message,field);
    RepeatedField<int>::RepeatedField
              ((RepeatedField<int> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep,
               (Arena *)0x0,pRVar21);
    iVar12 = field->number_;
    sVar24 = FieldDataOnlyByteSize(field,message);
    pbVar34 = stream->end_;
    if (pbVar34 <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pbVar34 = stream->end_;
    }
    if (pbVar34 <= target) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00266520;
    }
    uVar33 = (ulong)(iVar12 * 8 + 2);
    if (0x7f < (uint)(iVar12 << 3)) {
      do {
        uVar9 = (uint)uVar33;
        *target = (byte)uVar33 | 0x80;
        uVar33 = uVar33 >> 7;
        target = target + 1;
      } while (0x3fff < uVar9);
    }
    *target = (byte)uVar33;
    pbVar34 = target + 1;
    if (0x7f < (uint)sVar24) {
      do {
        target = pbVar34;
        uVar9 = (uint)sVar24;
        *target = (byte)sVar24 | 0x80;
        sVar24 = (size_t)(uVar9 >> 7);
        pbVar34 = target + 1;
      } while (0x3fff < uVar9);
    }
    *pbVar34 = (byte)sVar24;
    if ((local_e8._0_8_ & 4) == 0) {
      bVar7 = true;
      piVar26 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep).size;
    }
    else {
      piVar26 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep);
      bVar7 = (local_e8._0_8_ & 4) == 0;
    }
    iVar12 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep,
                          bVar7);
    target = target + 2;
    piVar1 = piVar26 + iVar12;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar14 = *piVar26 >> 0x1f ^ *piVar26 * 2;
      uVar9 = uVar14;
      if (0x7f < uVar14) {
        do {
          *target = (byte)uVar9 | 0x80;
          uVar14 = uVar9 >> 7;
          target = target + 1;
          bVar7 = 0x3fff < uVar9;
          uVar9 = uVar14;
        } while (bVar7);
      }
      piVar26 = piVar26 + 1;
      *target = (byte)uVar14;
      target = target + 1;
    } while (piVar26 < piVar1);
LAB_00265db6:
    RepeatedField<int>::~RepeatedField
              ((RepeatedField<int> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep)
    ;
    break;
  case '\x12':
    pRVar23 = Reflection::GetRepeatedFieldInternal<long>((Reflection *)pDVar31,message,field);
    RepeatedField<long>::RepeatedField
              ((RepeatedField<long> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep
               ,(Arena *)0x0,pRVar23);
    iVar12 = field->number_;
    sVar24 = FieldDataOnlyByteSize(field,message);
    pbVar34 = stream->end_;
    if (pbVar34 <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pbVar34 = stream->end_;
    }
    if (pbVar34 <= target) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      goto LAB_00266520;
    }
    uVar33 = (ulong)(iVar12 * 8 + 2);
    if (0x7f < (uint)(iVar12 << 3)) {
      do {
        uVar9 = (uint)uVar33;
        *target = (byte)uVar33 | 0x80;
        uVar33 = uVar33 >> 7;
        target = target + 1;
      } while (0x3fff < uVar9);
    }
    *target = (byte)uVar33;
    pbVar34 = target + 1;
    if (0x7f < (uint)sVar24) {
      do {
        target = pbVar34;
        uVar9 = (uint)sVar24;
        *target = (byte)sVar24 | 0x80;
        sVar24 = (size_t)(uVar9 >> 7);
        pbVar34 = target + 1;
      } while (0x3fff < uVar9);
    }
    *pbVar34 = (byte)sVar24;
    if ((local_e8._0_8_ & 4) == 0) {
      bVar7 = true;
      paVar27 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->short_rep).field_1;
    }
    else {
      paVar27 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1 *)
                LongSooRep::elements(&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep)
      ;
      bVar7 = (local_e8._0_8_ & 4) == 0;
    }
    iVar12 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep,
                          bVar7);
    target = target + 2;
    paVar2 = paVar27 + iVar12;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar28 = *(long *)paVar27->data >> 0x3f ^ *(long *)paVar27->data * 2;
      uVar33 = uVar28;
      if (0x7f < uVar28) {
        do {
          *target = (byte)uVar33 | 0x80;
          uVar28 = uVar33 >> 7;
          target = target + 1;
          bVar7 = 0x3fff < uVar33;
          uVar33 = uVar28;
        } while (bVar7);
      }
      paVar27 = paVar27 + 1;
      *target = (byte)uVar28;
      target = target + 1;
    } while (paVar27 < paVar2);
LAB_00265c6f:
    RepeatedField<long>::~RepeatedField
              ((RepeatedField<long> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_e8)->long_rep
              );
  }
LAB_00266198:
  if (local_f8 != (LogMessageData *)0x0) {
    uVar33 = (long)local_58 - (long)local_f8;
LAB_002661ac:
    operator_delete(local_f8,uVar33);
  }
  return target;
}

Assistant:

uint8_t* WireFormat::InternalSerializeField(const FieldDescriptor* field,
                                            const Message& message,
                                            uint8_t* target,
                                            io::EpsCopyOutputStream* stream) {
  const Reflection* message_reflection = message.GetReflection();

  if (field->is_extension() &&
      field->containing_type()->options().message_set_wire_format() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      !field->is_repeated()) {
    return InternalSerializeMessageSetItem(field, message, target, stream);
  }


  // For map fields, we can use either repeated field reflection or map
  // reflection.  Our choice has some subtle effects.  If we use repeated field
  // reflection here, then the repeated field representation becomes
  // authoritative for this field: any existing references that came from map
  // reflection remain valid for reading, but mutations to them are lost and
  // will be overwritten next time we call map reflection!
  //
  // So far this mainly affects Python, which keeps long-term references to map
  // values around, and always uses map reflection.  See: b/35918691
  //
  // Here we choose to use map reflection API as long as the internal
  // map is valid. In this way, the serialization doesn't change map field's
  // internal state and existing references that came from map reflection remain
  // valid for both reading and writing.
  if (field->is_map()) {
    const MapFieldBase* map_field =
        message_reflection->GetMapData(message, field);
    if (map_field->IsMapValid()) {
      if (stream->IsSerializationDeterministic()) {
        std::vector<MapKey> sorted_key_list =
            MapKeySorter::SortKey(message, message_reflection, field);
        for (std::vector<MapKey>::iterator it = sorted_key_list.begin();
             it != sorted_key_list.end(); ++it) {
          MapValueConstRef map_value;
          message_reflection->LookupMapValue(message, field, *it, &map_value);
          target =
              InternalSerializeMapEntry(field, *it, map_value, target, stream);
        }
      } else {
        for (MapIterator it = message_reflection->MapBegin(
                 const_cast<Message*>(&message), field);
             it !=
             message_reflection->MapEnd(const_cast<Message*>(&message), field);
             ++it) {
          target = InternalSerializeMapEntry(field, it.GetKey(),
                                             it.GetValueRef(), target, stream);
        }
      }

      return target;
    }
  }
  int count = 0;

  if (field->is_repeated()) {
    count = message_reflection->FieldSize(message, field);
  } else if (field->containing_type()->options().map_entry()) {
    // Map entry fields always need to be serialized.
    count = 1;
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  // map_entries is for maps that'll be deterministically serialized.
  std::vector<const Message*> map_entries;
  if (count > 1 && field->is_map() && stream->IsSerializationDeterministic()) {
    map_entries =
        DynamicMapSorter::Sort(message, count, message_reflection, field);
  }

  if (field->is_packed()) {
    if (count == 0) return target;
    target = stream->EnsureSpace(target);
    switch (field->type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)      \
  case FieldDescriptor::TYPE_##TYPE: {                                         \
    auto r =                                                                   \
        message_reflection->GetRepeatedFieldInternal<CPPTYPE>(message, field); \
    target = stream->Write##TYPE_METHOD##Packed(                               \
        field->number(), r, FieldDataOnlyByteSize(field, message), target);    \
    break;                                                                     \
  }

      HANDLE_PRIMITIVE_TYPE(INT32, int32_t, Int32, Int32)
      HANDLE_PRIMITIVE_TYPE(INT64, int64_t, Int64, Int64)
      HANDLE_PRIMITIVE_TYPE(SINT32, int32_t, SInt32, Int32)
      HANDLE_PRIMITIVE_TYPE(SINT64, int64_t, SInt64, Int64)
      HANDLE_PRIMITIVE_TYPE(UINT32, uint32_t, UInt32, UInt32)
      HANDLE_PRIMITIVE_TYPE(UINT64, uint64_t, UInt64, UInt64)
      HANDLE_PRIMITIVE_TYPE(ENUM, int, Enum, Enum)

#undef HANDLE_PRIMITIVE_TYPE
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)      \
  case FieldDescriptor::TYPE_##TYPE: {                                         \
    auto r =                                                                   \
        message_reflection->GetRepeatedFieldInternal<CPPTYPE>(message, field); \
    target = stream->WriteFixedPacked(field->number(), r, target);             \
    break;                                                                     \
  }

      HANDLE_PRIMITIVE_TYPE(FIXED32, uint32_t, Fixed32, UInt32)
      HANDLE_PRIMITIVE_TYPE(FIXED64, uint64_t, Fixed64, UInt64)
      HANDLE_PRIMITIVE_TYPE(SFIXED32, int32_t, SFixed32, Int32)
      HANDLE_PRIMITIVE_TYPE(SFIXED64, int64_t, SFixed64, Int64)

      HANDLE_PRIMITIVE_TYPE(FLOAT, float, Float, Float)
      HANDLE_PRIMITIVE_TYPE(DOUBLE, double, Double, Double)

      HANDLE_PRIMITIVE_TYPE(BOOL, bool, Bool, Bool)
#undef HANDLE_PRIMITIVE_TYPE
      default:
        ABSL_LOG(FATAL) << "Invalid descriptor";
    }
    return target;
  }

  auto get_message_from_field = [&message, &map_entries, message_reflection](
                                    const FieldDescriptor* field, int j) {
    if (!field->is_repeated()) {
      return &message_reflection->GetMessage(message, field);
    }
    if (!map_entries.empty()) {
      return map_entries[j];
    }
    return &message_reflection->GetRepeatedMessage(message, field, j);
  };
  for (int j = 0; j < count; j++) {
    target = stream->EnsureSpace(target);
    switch (field->type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)     \
  case FieldDescriptor::TYPE_##TYPE: {                                        \
    const CPPTYPE value =                                                     \
        field->is_repeated()                                                  \
            ? message_reflection->GetRepeated##CPPTYPE_METHOD(message, field, \
                                                              j)              \
            : message_reflection->Get##CPPTYPE_METHOD(message, field);        \
    target = WireFormatLite::Write##TYPE_METHOD##ToArray(field->number(),     \
                                                         value, target);      \
    break;                                                                    \
  }

      HANDLE_PRIMITIVE_TYPE(INT32, int32_t, Int32, Int32)
      HANDLE_PRIMITIVE_TYPE(INT64, int64_t, Int64, Int64)
      HANDLE_PRIMITIVE_TYPE(SINT32, int32_t, SInt32, Int32)
      HANDLE_PRIMITIVE_TYPE(SINT64, int64_t, SInt64, Int64)
      HANDLE_PRIMITIVE_TYPE(UINT32, uint32_t, UInt32, UInt32)
      HANDLE_PRIMITIVE_TYPE(UINT64, uint64_t, UInt64, UInt64)

      HANDLE_PRIMITIVE_TYPE(FIXED32, uint32_t, Fixed32, UInt32)
      HANDLE_PRIMITIVE_TYPE(FIXED64, uint64_t, Fixed64, UInt64)
      HANDLE_PRIMITIVE_TYPE(SFIXED32, int32_t, SFixed32, Int32)
      HANDLE_PRIMITIVE_TYPE(SFIXED64, int64_t, SFixed64, Int64)

      HANDLE_PRIMITIVE_TYPE(FLOAT, float, Float, Float)
      HANDLE_PRIMITIVE_TYPE(DOUBLE, double, Double, Double)

      HANDLE_PRIMITIVE_TYPE(BOOL, bool, Bool, Bool)
#undef HANDLE_PRIMITIVE_TYPE

      case FieldDescriptor::TYPE_GROUP: {
        auto* msg = get_message_from_field(field, j);
        target = WireFormatLite::InternalWriteGroup(field->number(), *msg,
                                                    target, stream);
      } break;

      case FieldDescriptor::TYPE_MESSAGE: {
        auto* msg = get_message_from_field(field, j);
        target = WireFormatLite::InternalWriteMessage(
            field->number(), *msg, msg->GetCachedSize(), target, stream);
      } break;

      case FieldDescriptor::TYPE_ENUM: {
        const EnumValueDescriptor* value =
            field->is_repeated()
                ? message_reflection->GetRepeatedEnum(message, field, j)
                : message_reflection->GetEnum(message, field);
        target = WireFormatLite::WriteEnumToArray(field->number(),
                                                  value->number(), target);
        break;
      }

      // Handle strings separately so that we can get string references
      // instead of copying.
      case FieldDescriptor::TYPE_STRING: {
        bool strict_utf8_check = field->requires_utf8_validation();
        std::string scratch;
        const std::string& value =
            field->is_repeated()
                ? message_reflection->GetRepeatedStringReference(message, field,
                                                                 j, &scratch)
                : message_reflection->GetStringReference(message, field,
                                                         &scratch);
        if (strict_utf8_check) {
          WireFormatLite::VerifyUtf8String(value.data(), value.length(),
                                           WireFormatLite::SERIALIZE,
                                           field->full_name());
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), SERIALIZE,
                                     field->full_name());
        }
        target = stream->WriteString(field->number(), value, target);
        break;
      }

      case FieldDescriptor::TYPE_BYTES: {
        if (field->cpp_string_type() == FieldDescriptor::CppStringType::kCord) {
          absl::Cord value = message_reflection->GetCord(message, field);
          target = stream->WriteString(field->number(), value, target);
          break;
        }
        std::string scratch;
        const std::string& value =
            field->is_repeated()
                ? message_reflection->GetRepeatedStringReference(message, field,
                                                                 j, &scratch)
                : message_reflection->GetStringReference(message, field,
                                                         &scratch);
        target = stream->WriteString(field->number(), value, target);
        break;
      }
    }
  }
  return target;
}